

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

bool ImGui_ImplSDL2_ProcessEvent(SDL_Event *event)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int *in_RDI;
  int key;
  ImGuiIO *io;
  bool local_1;
  
  pcVar3 = (char *)ImGui::GetIO();
  iVar1 = *in_RDI;
  if (iVar1 - 0x300U < 2) {
    pcVar3[(long)in_RDI[4] + 0x13c] = *in_RDI == 0x300;
    uVar2 = SDL_GetModState();
    pcVar3[0x139] = (uVar2 & 3) != 0;
    uVar2 = SDL_GetModState();
    pcVar3[0x138] = (uVar2 & 0xc0) != 0;
    uVar2 = SDL_GetModState();
    pcVar3[0x13a] = (uVar2 & 0x300) != 0;
    uVar2 = SDL_GetModState();
    pcVar3[0x13b] = (uVar2 & 0xc00) != 0;
    local_1 = true;
  }
  else if (iVar1 == 0x303) {
    ImGuiIO::AddInputCharactersUTF8(pcVar3);
    local_1 = true;
  }
  else if (iVar1 == 0x401) {
    if ((char)in_RDI[4] == '\x01') {
      g_MousePressed[0] = true;
    }
    if ((char)in_RDI[4] == '\x03') {
      g_MousePressed[1] = true;
    }
    if ((char)in_RDI[4] == '\x02') {
      g_MousePressed[2] = true;
    }
    local_1 = true;
  }
  else if (iVar1 == 0x403) {
    if (0 < in_RDI[4]) {
      *(float *)(pcVar3 + 0x134) = *(float *)(pcVar3 + 0x134) + 1.0;
    }
    if (in_RDI[4] < 0) {
      *(float *)(pcVar3 + 0x134) = *(float *)(pcVar3 + 0x134) - 1.0;
    }
    if (0 < in_RDI[5]) {
      *(float *)(pcVar3 + 0x130) = *(float *)(pcVar3 + 0x130) + 1.0;
    }
    if (in_RDI[5] < 0) {
      *(float *)(pcVar3 + 0x130) = *(float *)(pcVar3 + 0x130) - 1.0;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event* event)
{
    ImGuiIO& io = ImGui::GetIO();
    switch (event->type)
    {
    case SDL_MOUSEWHEEL:
        {
            if (event->wheel.x > 0) io.MouseWheelH += 1;
            if (event->wheel.x < 0) io.MouseWheelH -= 1;
            if (event->wheel.y > 0) io.MouseWheel += 1;
            if (event->wheel.y < 0) io.MouseWheel -= 1;
            return true;
        }
    case SDL_MOUSEBUTTONDOWN:
        {
            if (event->button.button == SDL_BUTTON_LEFT) g_MousePressed[0] = true;
            if (event->button.button == SDL_BUTTON_RIGHT) g_MousePressed[1] = true;
            if (event->button.button == SDL_BUTTON_MIDDLE) g_MousePressed[2] = true;
            return true;
        }
    case SDL_TEXTINPUT:
        {
            io.AddInputCharactersUTF8(event->text.text);
            return true;
        }
    case SDL_KEYDOWN:
    case SDL_KEYUP:
        {
            int key = event->key.keysym.scancode;
            IM_ASSERT(key >= 0 && key < IM_ARRAYSIZE(io.KeysDown));
            io.KeysDown[key] = (event->type == SDL_KEYDOWN);
            io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
            io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
            io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
#ifdef _WIN32
            io.KeySuper = false;
#else
            io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
#endif
            return true;
        }
    }
    return false;
}